

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *max,int param_2,bool param_3)

{
  uint *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Real a;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  double *pdVar14;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar15;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *max_00;
  type t;
  SPxId enterId;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_244;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  uint local_174;
  long local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  cpp_dec_float<50U,_int,_void> *local_118;
  DataKey local_110;
  cpp_dec_float<50U,_int,_void> local_108;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  long local_70;
  long local_68;
  long local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])
                     (this,max,CONCAT44(in_register_00000014,param_2),
                      CONCAT71(in_register_00000009,param_3));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar12) + 0xa58) + 0x50));
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_00,iVar12) + 0xa60) + 0x50));
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_c8 = **(long **)(CONCAT44(extraout_var_01,iVar12) + 0xa60);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar16 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar12) + 0xa60) + 0x70);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar17 = *(long *)(CONCAT44(extraout_var_03,iVar12) + 0xa60);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar19 = **(long **)(CONCAT44(extraout_var_04,iVar12) + 0xa80);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_68 = **(long **)(CONCAT44(extraout_var_05,iVar12) + 0xa78);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_c0 = **(long **)(CONCAT44(extraout_var_06,iVar12) + 0xa58);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar21 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar12) + 0xa58) + 0x70);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_170 = *(long *)(CONCAT44(extraout_var_08,iVar12) + 0xa58);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_b0 = **(long **)(CONCAT44(extraout_var_09,iVar12) + 0xa90);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_60 = **(long **)(CONCAT44(extraout_var_10,iVar12) + 0xa88);
  local_128 = this;
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_11,iVar12) + 0x1e0));
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,a);
  local_1b8.data._M_elems._32_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 8);
  local_1b8.data._M_elems._0_8_ = *(undefined8 *)(max->m_backend).data._M_elems;
  local_1b8.data._M_elems._8_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 2);
  local_1b8.data._M_elems._16_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 4);
  local_1b8.data._M_elems._24_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 6);
  local_1b8.exp = (max->m_backend).exp;
  local_1b8.neg = (max->m_backend).neg;
  local_1b8.fpclass = (max->m_backend).fpclass;
  local_1b8.prec_elem = (max->m_backend).prec_elem;
  local_110.info = 0;
  local_110.idx = -1;
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems._24_5_ = 0;
  local_108.data._M_elems[7]._1_3_ = 0;
  local_108.data._M_elems._32_5_ = 0;
  local_108.data._M_elems[9]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  local_120 = max;
  local_b8 = lVar19;
  if (local_1b8.fpclass == cpp_dec_float_NaN) {
LAB_002cb961:
    local_174 = 0xffffffff;
    local_244 = 0xffffffff;
    if (0 < *(int *)(lVar17 + 0x58)) {
      pdVar14 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_58 = *pdVar14;
      uStack_50 = 0;
      local_48 = -local_58;
      uStack_40 = 0x8000000000000000;
      local_118 = &(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_244 = 0xffffffff;
      lVar19 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar17 + 0x60) + lVar19 * 4);
        lVar23 = (long)iVar12 * 0x38;
        uVar3 = *(undefined8 *)(lVar16 + 0x20 + lVar23);
        local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar23);
        local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar23) + 2);
        puVar1 = (uint *)(lVar16 + 0x10 + lVar23);
        local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.exp = *(int *)(lVar16 + 0x28 + lVar23);
        local_108.neg = *(bool *)(lVar16 + 0x2c + lVar23);
        local_108._48_8_ = *(undefined8 *)(lVar16 + 0x30 + lVar23);
        if (((local_108.fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_108,&local_a8), iVar13 < 1)) {
          uVar3._0_4_ = local_a8.data._M_elems[0];
          uVar3._4_4_ = local_a8.data._M_elems[1];
          local_238.data._M_elems[0] = local_a8.data._M_elems[0];
          local_238.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar9._0_4_ = local_a8.data._M_elems[2];
          uVar9._4_4_ = local_a8.data._M_elems[3];
          local_238.data._M_elems[2] = local_a8.data._M_elems[2];
          local_238.data._M_elems[3] = local_a8.data._M_elems[3];
          local_238.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
          local_238.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
          local_238.data._M_elems[4] = local_a8.data._M_elems[4];
          local_238.data._M_elems[5] = local_a8.data._M_elems[5];
          local_238.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
          local_238.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
          local_238.exp = local_a8.exp;
          local_238.neg = local_a8.neg;
          local_238.fpclass = local_a8.fpclass;
          local_238.prec_elem = local_a8.prec_elem;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_238.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar8 = uVar3;
          uVar10 = uVar9;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar8 = local_238.data._M_elems._0_8_, uVar10 = local_238.data._M_elems._8_8_,
              local_108.fpclass != cpp_dec_float_NaN)) &&
             (local_238.data._M_elems._0_8_ = uVar3, local_238.data._M_elems._8_8_ = uVar9,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_108,&local_238), uVar8 = local_238.data._M_elems._0_8_,
             uVar10 = local_238.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_68 + lVar23);
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems._24_5_ = 0;
            local_238.data._M_elems[7]._1_3_ = 0;
            local_238.data._M_elems._32_5_ = 0;
            local_238.data._M_elems[9]._1_3_ = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_238,local_58);
            uVar8 = local_238.data._M_elems._0_8_;
            uVar10 = local_238.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar20,&local_238), uVar8 = local_238.data._M_elems._0_8_,
                     uVar10 = local_238.data._M_elems._8_8_, iVar13 < 0)) {
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8.data._M_elems[9]._1_3_ = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              if (&local_1f8 == (cpp_dec_float<50U,_int,_void> *)(lVar23 + local_c8)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1f8,pcVar20);
                if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                  local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                }
              }
              else {
                if (&local_1f8 != pcVar20) {
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_1f8.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_1f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1f8.exp = pcVar20->exp;
                  local_1f8.neg = pcVar20->neg;
                  local_1f8.fpclass = pcVar20->fpclass;
                  local_1f8.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1f8,(cpp_dec_float<50U,_int,_void> *)(lVar23 + local_c8));
              }
              local_168.fpclass = cpp_dec_float_finite;
              local_168.prec_elem = 10;
              local_168.data._M_elems[0] = 0;
              local_168.data._M_elems[1] = 0;
              local_168.data._M_elems[2] = 0;
              local_168.data._M_elems[3] = 0;
              local_168.data._M_elems[4] = 0;
              local_168.data._M_elems[5] = 0;
              local_168.data._M_elems._24_5_ = 0;
              local_168.data._M_elems[7]._1_3_ = 0;
              local_168.data._M_elems._32_5_ = 0;
              local_168.data._M_elems[9]._1_3_ = 0;
              local_168.exp = 0;
              local_168.neg = false;
              pcVar20 = &local_1f8;
              if (&local_168 != local_118) {
                local_168.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
                local_168.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
                local_168.data._M_elems[4] = local_1f8.data._M_elems[4];
                local_168.data._M_elems[5] = local_1f8.data._M_elems[5];
                local_168.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
                local_168.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
                local_168.data._M_elems[0] = local_1f8.data._M_elems[0];
                local_168.data._M_elems[1] = local_1f8.data._M_elems[1];
                local_168.data._M_elems[2] = local_1f8.data._M_elems[2];
                local_168.data._M_elems[3] = local_1f8.data._M_elems[3];
                local_168.exp = local_1f8.exp;
                local_168.neg = local_1f8.neg;
                local_168.fpclass = local_1f8.fpclass;
                local_168.prec_elem = local_1f8.prec_elem;
                pcVar20 = local_118;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_168,pcVar20);
              goto LAB_002cbe95;
            }
          }
        }
        else {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_b8 + lVar23);
          local_238.fpclass = cpp_dec_float_finite;
          local_238.prec_elem = 10;
          local_238.data._M_elems[0] = 0;
          local_238.data._M_elems[1] = 0;
          local_238.data._M_elems[2] = 0;
          local_238.data._M_elems[3] = 0;
          local_238.data._M_elems[4] = 0;
          local_238.data._M_elems[5] = 0;
          local_238.data._M_elems._24_5_ = 0;
          local_238.data._M_elems[7]._1_3_ = 0;
          local_238.data._M_elems._32_5_ = 0;
          local_238.data._M_elems[9]._1_3_ = 0;
          local_238.exp = 0;
          local_238.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_238,local_48);
          uVar8 = local_238.data._M_elems._0_8_;
          uVar10 = local_238.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar20,&local_238), uVar8 = local_238.data._M_elems._0_8_,
                uVar10 = local_238.data._M_elems._8_8_, 0 < iVar13)) {
            local_1f8.fpclass = cpp_dec_float_finite;
            local_1f8.prec_elem = 10;
            local_1f8.data._M_elems[0] = 0;
            local_1f8.data._M_elems[1] = 0;
            local_1f8.data._M_elems[2] = 0;
            local_1f8.data._M_elems[3] = 0;
            local_1f8.data._M_elems[4] = 0;
            local_1f8.data._M_elems[5] = 0;
            local_1f8.data._M_elems._24_5_ = 0;
            local_1f8.data._M_elems[7]._1_3_ = 0;
            local_1f8.data._M_elems._32_5_ = 0;
            local_1f8.data._M_elems[9]._1_3_ = 0;
            local_1f8.exp = 0;
            local_1f8.neg = false;
            if (&local_1f8 == (cpp_dec_float<50U,_int,_void> *)(lVar23 + local_c8)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,pcVar20);
              if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                local_1f8.neg = (bool)(local_1f8.neg ^ 1);
              }
            }
            else {
              if (&local_1f8 != pcVar20) {
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_1f8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_1f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1f8.exp = pcVar20->exp;
                local_1f8.neg = pcVar20->neg;
                local_1f8.fpclass = pcVar20->fpclass;
                local_1f8.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,(cpp_dec_float<50U,_int,_void> *)(lVar23 + local_c8));
            }
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168.data._M_elems[9]._1_3_ = 0;
            local_168.exp = 0;
            local_168.neg = false;
            if (&local_168 == local_118) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,&local_1f8);
              if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                local_168.neg = (bool)(local_168.neg ^ 1);
              }
            }
            else {
              local_168.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1f8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1f8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1f8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1f8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1f8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1f8.data._M_elems[3];
              local_168.exp = local_1f8.exp;
              local_168.neg = local_1f8.neg;
              local_168.fpclass = local_1f8.fpclass;
              local_168.prec_elem = local_1f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,local_118);
            }
LAB_002cbe95:
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems._24_5_ = 0;
            local_238.data._M_elems[7]._1_3_ = 0;
            local_238.data._M_elems._32_5_ = 0;
            local_238.data._M_elems[9]._1_3_ = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_238,&local_168,&local_108);
            uVar8 = local_238.data._M_elems._0_8_;
            uVar10 = local_238.data._M_elems._8_8_;
            if (((local_238.fpclass != cpp_dec_float_NaN) &&
                (local_1b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_238,&local_1b8), uVar8 = local_238.data._M_elems._0_8_,
               uVar10 = local_238.data._M_elems._8_8_, 0 < iVar13)) {
              iVar13 = (*(local_128->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_110 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_13,iVar13),iVar12);
              local_1b8.data._M_elems[4] = local_238.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_238.data._M_elems[5];
              local_1b8.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
              local_1b8.data._M_elems[0] = local_238.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_238.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_238.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_238.data._M_elems[3];
              local_1b8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
              local_1b8.exp = local_238.exp;
              local_1b8.neg = local_238.neg;
              local_1b8.fpclass = local_238.fpclass;
              local_1b8.prec_elem = local_238.prec_elem;
              local_244 = (uint)lVar19;
              uVar8 = local_238.data._M_elems._0_8_;
              uVar10 = local_238.data._M_elems._8_8_;
            }
          }
        }
        local_238.data._M_elems._8_8_ = uVar10;
        local_238.data._M_elems._0_8_ = uVar8;
        lVar19 = lVar19 + 1;
      } while (lVar19 < *(int *)(lVar17 + 0x58));
    }
    lVar19 = local_170;
    if (0 < *(int *)(local_170 + 0x58)) {
      pdVar14 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_58 = *pdVar14;
      uStack_50 = 0;
      local_48 = -local_58;
      uStack_40 = 0x8000000000000000;
      local_118 = &(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_174 = 0xffffffff;
      lVar23 = 0;
      local_70 = lVar16;
      do {
        iVar12 = *(int *)(*(long *)(lVar19 + 0x60) + lVar23 * 4);
        lVar24 = (long)iVar12 * 0x38;
        uVar3 = *(undefined8 *)(lVar21 + 0x20 + lVar24);
        local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar21 + lVar24);
        local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar21 + lVar24) + 2);
        puVar1 = (uint *)(lVar21 + 0x10 + lVar24);
        local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.exp = *(int *)(lVar21 + 0x28 + lVar24);
        local_108.neg = *(bool *)(lVar21 + 0x2c + lVar24);
        local_108._48_8_ = *(undefined8 *)(lVar21 + 0x30 + lVar24);
        if (((local_108.fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_108,&local_a8), iVar13 < 1)) {
          uVar8._0_4_ = local_a8.data._M_elems[0];
          uVar8._4_4_ = local_a8.data._M_elems[1];
          local_238.data._M_elems[0] = local_a8.data._M_elems[0];
          local_238.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar10._0_4_ = local_a8.data._M_elems[2];
          uVar10._4_4_ = local_a8.data._M_elems[3];
          local_238.data._M_elems[2] = local_a8.data._M_elems[2];
          local_238.data._M_elems[3] = local_a8.data._M_elems[3];
          local_238.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
          local_238.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
          local_238.data._M_elems[4] = local_a8.data._M_elems[4];
          local_238.data._M_elems[5] = local_a8.data._M_elems[5];
          local_238.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
          local_238.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
          local_238.exp = local_a8.exp;
          local_238.neg = local_a8.neg;
          local_238.fpclass = local_a8.fpclass;
          local_238.prec_elem = local_a8.prec_elem;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_238.neg = (bool)(local_a8.neg ^ 1);
          }
          lVar19 = local_170;
          uVar3 = uVar8;
          uVar9 = uVar10;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
              local_108.fpclass != cpp_dec_float_NaN)) &&
             (local_238.data._M_elems._0_8_ = uVar8, local_238.data._M_elems._8_8_ = uVar10,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_108,&local_238), lVar19 = local_170,
             uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
             iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_60 + lVar24);
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems._24_5_ = 0;
            local_238.data._M_elems[7]._1_3_ = 0;
            local_238.data._M_elems._32_5_ = 0;
            local_238.data._M_elems[9]._1_3_ = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_238,local_58);
            lVar19 = local_170;
            uVar3 = local_238.data._M_elems._0_8_;
            uVar9 = local_238.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar20,&local_238), lVar19 = local_170,
                     uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
                     iVar13 < 0)) {
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8.data._M_elems[9]._1_3_ = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              if (&local_1f8 == (cpp_dec_float<50U,_int,_void> *)(lVar24 + local_c0)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1f8,pcVar20);
                if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                  local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                }
              }
              else {
                if (&local_1f8 != pcVar20) {
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_1f8.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_1f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1f8.exp = pcVar20->exp;
                  local_1f8.neg = pcVar20->neg;
                  local_1f8.fpclass = pcVar20->fpclass;
                  local_1f8.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1f8,(cpp_dec_float<50U,_int,_void> *)(lVar24 + local_c0));
              }
              lVar19 = local_170;
              local_168.fpclass = cpp_dec_float_finite;
              local_168.prec_elem = 10;
              local_168.data._M_elems[0] = 0;
              local_168.data._M_elems[1] = 0;
              local_168.data._M_elems[2] = 0;
              local_168.data._M_elems[3] = 0;
              local_168.data._M_elems[4] = 0;
              local_168.data._M_elems[5] = 0;
              local_168.data._M_elems._24_5_ = 0;
              local_168.data._M_elems[7]._1_3_ = 0;
              local_168.data._M_elems._32_5_ = 0;
              local_168.data._M_elems[9]._1_3_ = 0;
              local_168.exp = 0;
              local_168.neg = false;
              pcVar20 = &local_1f8;
              if (&local_168 != local_118) {
                local_168.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
                local_168.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
                local_168.data._M_elems[4] = local_1f8.data._M_elems[4];
                local_168.data._M_elems[5] = local_1f8.data._M_elems[5];
                local_168.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
                local_168.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
                local_168.data._M_elems[0] = local_1f8.data._M_elems[0];
                local_168.data._M_elems[1] = local_1f8.data._M_elems[1];
                local_168.data._M_elems[2] = local_1f8.data._M_elems[2];
                local_168.data._M_elems[3] = local_1f8.data._M_elems[3];
                local_168.exp = local_1f8.exp;
                local_168.neg = local_1f8.neg;
                local_168.fpclass = local_1f8.fpclass;
                local_168.prec_elem = local_1f8.prec_elem;
                pcVar20 = local_118;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_168,pcVar20);
              goto LAB_002cc4b5;
            }
          }
        }
        else {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_b0 + lVar24);
          local_238.fpclass = cpp_dec_float_finite;
          local_238.prec_elem = 10;
          local_238.data._M_elems[0] = 0;
          local_238.data._M_elems[1] = 0;
          local_238.data._M_elems[2] = 0;
          local_238.data._M_elems[3] = 0;
          local_238.data._M_elems[4] = 0;
          local_238.data._M_elems[5] = 0;
          local_238.data._M_elems._24_5_ = 0;
          local_238.data._M_elems[7]._1_3_ = 0;
          local_238.data._M_elems._32_5_ = 0;
          local_238.data._M_elems[9]._1_3_ = 0;
          local_238.exp = 0;
          local_238.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_238,local_48);
          lVar19 = local_170;
          uVar3 = local_238.data._M_elems._0_8_;
          uVar9 = local_238.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar20,&local_238), lVar19 = local_170,
                uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
                0 < iVar13)) {
            local_1f8.fpclass = cpp_dec_float_finite;
            local_1f8.prec_elem = 10;
            local_1f8.data._M_elems[0] = 0;
            local_1f8.data._M_elems[1] = 0;
            local_1f8.data._M_elems[2] = 0;
            local_1f8.data._M_elems[3] = 0;
            local_1f8.data._M_elems[4] = 0;
            local_1f8.data._M_elems[5] = 0;
            local_1f8.data._M_elems._24_5_ = 0;
            local_1f8.data._M_elems[7]._1_3_ = 0;
            local_1f8.data._M_elems._32_5_ = 0;
            local_1f8.data._M_elems[9]._1_3_ = 0;
            local_1f8.exp = 0;
            local_1f8.neg = false;
            if (&local_1f8 == (cpp_dec_float<50U,_int,_void> *)(lVar24 + local_c0)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,pcVar20);
              if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                local_1f8.neg = (bool)(local_1f8.neg ^ 1);
              }
            }
            else {
              if (&local_1f8 != pcVar20) {
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_1f8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_1f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1f8.exp = pcVar20->exp;
                local_1f8.neg = pcVar20->neg;
                local_1f8.fpclass = pcVar20->fpclass;
                local_1f8.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,(cpp_dec_float<50U,_int,_void> *)(lVar24 + local_c0));
            }
            lVar19 = local_170;
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168.data._M_elems[9]._1_3_ = 0;
            local_168.exp = 0;
            local_168.neg = false;
            if (&local_168 == local_118) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,&local_1f8);
              if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                local_168.neg = (bool)(local_168.neg ^ 1);
              }
            }
            else {
              local_168.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1f8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1f8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1f8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1f8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1f8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1f8.data._M_elems[3];
              local_168.exp = local_1f8.exp;
              local_168.neg = local_1f8.neg;
              local_168.fpclass = local_1f8.fpclass;
              local_168.prec_elem = local_1f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,local_118);
            }
LAB_002cc4b5:
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems._24_5_ = 0;
            local_238.data._M_elems[7]._1_3_ = 0;
            local_238.data._M_elems._32_5_ = 0;
            local_238.data._M_elems[9]._1_3_ = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_238,&local_168,&local_108);
            lVar16 = local_70;
            uVar3 = local_238.data._M_elems._0_8_;
            uVar9 = local_238.data._M_elems._8_8_;
            if (((local_238.fpclass != cpp_dec_float_NaN) &&
                (local_1b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_238,&local_1b8), uVar3 = local_238.data._M_elems._0_8_,
               uVar9 = local_238.data._M_elems._8_8_, 0 < iVar13)) {
              iVar13 = (*(local_128->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_110 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(extraout_var_14,iVar13),iVar12);
              local_1b8.data._M_elems[4] = local_238.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_238.data._M_elems[5];
              local_1b8.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
              local_1b8.data._M_elems[0] = local_238.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_238.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_238.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_238.data._M_elems[3];
              local_1b8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
              local_1b8.exp = local_238.exp;
              local_1b8.neg = local_238.neg;
              local_1b8.fpclass = local_238.fpclass;
              local_1b8.prec_elem = local_238.prec_elem;
              local_174 = (uint)lVar23;
              uVar3 = local_238.data._M_elems._0_8_;
              uVar9 = local_238.data._M_elems._8_8_;
            }
          }
        }
        local_238.data._M_elems._8_8_ = uVar9;
        local_238.data._M_elems._0_8_ = uVar3;
        lVar23 = lVar23 + 1;
      } while (lVar23 < *(int *)(lVar19 + 0x58));
    }
    lVar22 = local_b0;
    lVar24 = local_b8;
    lVar23 = local_c8;
    max_00 = local_120;
    uVar18 = local_174;
    if ((int)local_174 < 0) {
      if ((int)local_244 < 0) goto LAB_002cd10f;
      lVar17 = (long)*(int *)(*(long *)(lVar17 + 0x60) + (ulong)local_244 * 4) * 0x38;
      uVar3 = *(undefined8 *)(lVar16 + 0x20 + lVar17);
      local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar17);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar17) + 2);
      puVar1 = (uint *)(lVar16 + 0x10 + lVar17);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(lVar16 + 0x28 + lVar17);
      local_108.neg = *(bool *)(lVar16 + 0x2c + lVar17);
      local_108._48_8_ = *(undefined8 *)(lVar16 + 0x30 + lVar17);
      if (((local_108.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_108,&local_a8), iVar12 < 0)) {
        lVar24 = local_68;
      }
      goto LAB_002ccfae;
    }
    lVar16 = (long)*(int *)(*(long *)(lVar19 + 0x60) + (ulong)local_174 * 4) * 0x38;
    uVar3 = *(undefined8 *)(lVar21 + 0x20 + lVar16);
    local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar21 + lVar16);
    local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar21 + lVar16) + 2);
    puVar1 = (uint *)(lVar21 + 0x10 + lVar16);
    local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.exp = *(int *)(lVar21 + 0x28 + lVar16);
    local_108.neg = *(bool *)(lVar21 + 0x2c + lVar16);
    local_108._48_8_ = *(undefined8 *)(lVar21 + 0x30 + lVar16);
    if (((local_108.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_108,&local_a8), iVar12 < 0)) {
      lVar22 = local_60;
    }
LAB_002cce10:
    local_1b8.data._M_elems._32_8_ = *(undefined8 *)(lVar22 + 0x20 + lVar16);
    local_1b8.data._M_elems._0_8_ = *(undefined8 *)(lVar22 + lVar16);
    local_1b8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar22 + lVar16) + 2);
    puVar1 = (uint *)(lVar22 + 0x10 + lVar16);
    local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1b8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1b8.exp = *(int *)(lVar22 + 0x28 + lVar16);
    local_1b8.neg = *(bool *)(lVar22 + 0x2c + lVar16);
    local_1b8.fpclass = *(fpclass_type *)(lVar22 + 0x30 + lVar16);
    local_1b8.prec_elem = *(int32_t *)(lVar22 + 0x34 + lVar16);
    pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_c0 + lVar16);
    if (&local_168 == pcVar20) goto LAB_002cd06c;
    local_168.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
    local_168.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
    local_168.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
    local_168.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
    local_168.prec_elem = local_1b8.prec_elem;
    local_168.fpclass = local_1b8.fpclass;
    local_168.data._M_elems._0_8_ = local_1b8.data._M_elems._0_8_;
    local_168.data._M_elems._8_8_ = local_1b8.data._M_elems._8_8_;
    local_168.data._M_elems._16_8_ = local_1b8.data._M_elems._16_8_;
    local_168.exp = local_1b8.exp;
    local_168.neg = local_1b8.neg;
LAB_002cd065:
    local_1b8.data._M_elems._0_8_ = local_168.data._M_elems._0_8_;
    local_1b8.data._M_elems._8_8_ = local_168.data._M_elems._8_8_;
    local_1b8.data._M_elems._16_8_ = local_168.data._M_elems._16_8_;
    local_1b8.exp = local_168.exp;
    local_1b8.neg = local_168.neg;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_168,pcVar20);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_238,0,(type *)0x0);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1b8,&local_238);
    if (iVar12 < 1) goto LAB_002cb961;
    local_174 = 0xffffffff;
    local_244 = 0xffffffff;
    if (0 < *(int *)(lVar17 + 0x58)) {
      pdVar14 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_48 = *pdVar14;
      local_118 = &(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      uStack_40 = 0;
      local_58 = -local_48;
      uStack_50 = 0x8000000000000000;
      local_244 = 0xffffffff;
      lVar19 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar17 + 0x60) + lVar19 * 4);
        lVar23 = (long)iVar12 * 0x38;
        uVar3 = *(undefined8 *)(lVar16 + 0x20 + lVar23);
        local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar23);
        local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar23) + 2);
        puVar1 = (uint *)(lVar16 + 0x10 + lVar23);
        local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.exp = *(int *)(lVar16 + 0x28 + lVar23);
        local_108.neg = *(bool *)(lVar16 + 0x2c + lVar23);
        local_108._48_8_ = *(undefined8 *)(lVar16 + 0x30 + lVar23);
        if (((local_108.fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_108,&local_a8), iVar13 < 1)) {
          uVar4._0_4_ = local_a8.data._M_elems[0];
          uVar4._4_4_ = local_a8.data._M_elems[1];
          local_238.data._M_elems[0] = local_a8.data._M_elems[0];
          local_238.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar5._0_4_ = local_a8.data._M_elems[2];
          uVar5._4_4_ = local_a8.data._M_elems[3];
          local_238.data._M_elems[2] = local_a8.data._M_elems[2];
          local_238.data._M_elems[3] = local_a8.data._M_elems[3];
          local_238.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
          local_238.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
          local_238.data._M_elems[4] = local_a8.data._M_elems[4];
          local_238.data._M_elems[5] = local_a8.data._M_elems[5];
          local_238.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
          local_238.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
          local_238.exp = local_a8.exp;
          local_238.neg = local_a8.neg;
          local_238.fpclass = local_a8.fpclass;
          local_238.prec_elem = local_a8.prec_elem;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_238.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar3 = uVar4;
          uVar9 = uVar5;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
              local_108.fpclass != cpp_dec_float_NaN)) &&
             (local_238.data._M_elems._0_8_ = uVar4, local_238.data._M_elems._8_8_ = uVar5,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_108,&local_238), uVar3 = local_238.data._M_elems._0_8_,
             uVar9 = local_238.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_b8 + lVar23);
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems._24_5_ = 0;
            local_238.data._M_elems[7]._1_3_ = 0;
            local_238.data._M_elems._32_5_ = 0;
            local_238.data._M_elems[9]._1_3_ = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_238,local_58);
            uVar3 = local_238.data._M_elems._0_8_;
            uVar9 = local_238.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar20,&local_238), uVar3 = local_238.data._M_elems._0_8_,
                     uVar9 = local_238.data._M_elems._8_8_, 0 < iVar13)) {
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8.data._M_elems[9]._1_3_ = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              if (&local_1f8 == (cpp_dec_float<50U,_int,_void> *)(lVar23 + local_c8)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1f8,pcVar20);
                if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                  local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                }
              }
              else {
                if (&local_1f8 != pcVar20) {
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_1f8.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_1f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1f8.exp = pcVar20->exp;
                  local_1f8.neg = pcVar20->neg;
                  local_1f8.fpclass = pcVar20->fpclass;
                  local_1f8.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1f8,(cpp_dec_float<50U,_int,_void> *)(lVar23 + local_c8));
              }
              local_168.fpclass = cpp_dec_float_finite;
              local_168.prec_elem = 10;
              local_168.data._M_elems[0] = 0;
              local_168.data._M_elems[1] = 0;
              local_168.data._M_elems[2] = 0;
              local_168.data._M_elems[3] = 0;
              local_168.data._M_elems[4] = 0;
              local_168.data._M_elems[5] = 0;
              local_168.data._M_elems._24_5_ = 0;
              local_168.data._M_elems[7]._1_3_ = 0;
              local_168.data._M_elems._32_5_ = 0;
              local_168.data._M_elems[9]._1_3_ = 0;
              local_168.exp = 0;
              local_168.neg = false;
              if (&local_168 == local_118) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_168,&local_1f8);
                if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                  local_168.neg = (bool)(local_168.neg ^ 1);
                }
              }
              else {
                local_168.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
                local_168.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
                local_168.data._M_elems[4] = local_1f8.data._M_elems[4];
                local_168.data._M_elems[5] = local_1f8.data._M_elems[5];
                local_168.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
                local_168.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
                local_168.data._M_elems[0] = local_1f8.data._M_elems[0];
                local_168.data._M_elems[1] = local_1f8.data._M_elems[1];
                local_168.data._M_elems[2] = local_1f8.data._M_elems[2];
                local_168.data._M_elems[3] = local_1f8.data._M_elems[3];
                local_168.exp = local_1f8.exp;
                local_168.neg = local_1f8.neg;
                local_168.fpclass = local_1f8.fpclass;
                local_168.prec_elem = local_1f8.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_168,local_118);
              }
              goto LAB_002cb884;
            }
          }
        }
        else {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_68 + lVar23);
          local_238.fpclass = cpp_dec_float_finite;
          local_238.prec_elem = 10;
          local_238.data._M_elems[0] = 0;
          local_238.data._M_elems[1] = 0;
          local_238.data._M_elems[2] = 0;
          local_238.data._M_elems[3] = 0;
          local_238.data._M_elems[4] = 0;
          local_238.data._M_elems[5] = 0;
          local_238.data._M_elems._24_5_ = 0;
          local_238.data._M_elems[7]._1_3_ = 0;
          local_238.data._M_elems._32_5_ = 0;
          local_238.data._M_elems[9]._1_3_ = 0;
          local_238.exp = 0;
          local_238.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_238,local_48);
          uVar3 = local_238.data._M_elems._0_8_;
          uVar9 = local_238.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar20,&local_238), uVar3 = local_238.data._M_elems._0_8_,
                uVar9 = local_238.data._M_elems._8_8_, iVar13 < 0)) {
            local_1f8.fpclass = cpp_dec_float_finite;
            local_1f8.prec_elem = 10;
            local_1f8.data._M_elems[0] = 0;
            local_1f8.data._M_elems[1] = 0;
            local_1f8.data._M_elems[2] = 0;
            local_1f8.data._M_elems[3] = 0;
            local_1f8.data._M_elems[4] = 0;
            local_1f8.data._M_elems[5] = 0;
            local_1f8.data._M_elems._24_5_ = 0;
            local_1f8.data._M_elems[7]._1_3_ = 0;
            local_1f8.data._M_elems._32_5_ = 0;
            local_1f8.data._M_elems[9]._1_3_ = 0;
            local_1f8.exp = 0;
            local_1f8.neg = false;
            if (&local_1f8 == (cpp_dec_float<50U,_int,_void> *)(lVar23 + local_c8)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,pcVar20);
              if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                local_1f8.neg = (bool)(local_1f8.neg ^ 1);
              }
            }
            else {
              if (&local_1f8 != pcVar20) {
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_1f8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_1f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1f8.exp = pcVar20->exp;
                local_1f8.neg = pcVar20->neg;
                local_1f8.fpclass = pcVar20->fpclass;
                local_1f8.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,(cpp_dec_float<50U,_int,_void> *)(lVar23 + local_c8));
            }
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168.data._M_elems[9]._1_3_ = 0;
            local_168.exp = 0;
            local_168.neg = false;
            pcVar20 = &local_1f8;
            if (&local_168 != local_118) {
              local_168.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1f8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1f8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1f8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1f8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1f8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1f8.data._M_elems[3];
              local_168.exp = local_1f8.exp;
              local_168.neg = local_1f8.neg;
              local_168.fpclass = local_1f8.fpclass;
              local_168.prec_elem = local_1f8.prec_elem;
              pcVar20 = local_118;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_168,pcVar20);
LAB_002cb884:
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems._24_5_ = 0;
            local_238.data._M_elems[7]._1_3_ = 0;
            local_238.data._M_elems._32_5_ = 0;
            local_238.data._M_elems[9]._1_3_ = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_238,&local_168,&local_108);
            uVar3 = local_238.data._M_elems._0_8_;
            uVar9 = local_238.data._M_elems._8_8_;
            if (((local_238.fpclass != cpp_dec_float_NaN) &&
                (local_1b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_238,&local_1b8), uVar3 = local_238.data._M_elems._0_8_,
               uVar9 = local_238.data._M_elems._8_8_, iVar13 < 0)) {
              iVar13 = (*(local_128->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_110 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_12,iVar13),iVar12);
              local_1b8.data._M_elems[4] = local_238.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_238.data._M_elems[5];
              local_1b8.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
              local_1b8.data._M_elems[0] = local_238.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_238.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_238.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_238.data._M_elems[3];
              local_1b8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
              local_1b8.exp = local_238.exp;
              local_1b8.neg = local_238.neg;
              local_1b8.fpclass = local_238.fpclass;
              local_1b8.prec_elem = local_238.prec_elem;
              local_244 = (uint)lVar19;
              uVar3 = local_238.data._M_elems._0_8_;
              uVar9 = local_238.data._M_elems._8_8_;
            }
          }
        }
        local_238.data._M_elems._8_8_ = uVar9;
        local_238.data._M_elems._0_8_ = uVar3;
        lVar19 = lVar19 + 1;
      } while (lVar19 < *(int *)(lVar17 + 0x58));
    }
    lVar19 = local_170;
    if (0 < *(int *)(local_170 + 0x58)) {
      pdVar14 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_48 = *pdVar14;
      local_118 = &(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      uStack_40 = 0;
      local_58 = -local_48;
      uStack_50 = 0x8000000000000000;
      local_174 = 0xffffffff;
      lVar23 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar19 + 0x60) + lVar23 * 4);
        lVar24 = (long)iVar12 * 0x38;
        uVar3 = *(undefined8 *)(lVar21 + 0x20 + lVar24);
        local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar21 + lVar24);
        local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar21 + lVar24) + 2);
        puVar1 = (uint *)(lVar21 + 0x10 + lVar24);
        local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.exp = *(int *)(lVar21 + 0x28 + lVar24);
        local_108.neg = *(bool *)(lVar21 + 0x2c + lVar24);
        local_108._48_8_ = *(undefined8 *)(lVar21 + 0x30 + lVar24);
        if (((local_108.fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_108,&local_a8), iVar13 < 1)) {
          uVar6._0_4_ = local_a8.data._M_elems[0];
          uVar6._4_4_ = local_a8.data._M_elems[1];
          local_238.data._M_elems[0] = local_a8.data._M_elems[0];
          local_238.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar7._0_4_ = local_a8.data._M_elems[2];
          uVar7._4_4_ = local_a8.data._M_elems[3];
          local_238.data._M_elems[2] = local_a8.data._M_elems[2];
          local_238.data._M_elems[3] = local_a8.data._M_elems[3];
          local_238.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
          local_238.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
          local_238.data._M_elems[4] = local_a8.data._M_elems[4];
          local_238.data._M_elems[5] = local_a8.data._M_elems[5];
          local_238.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
          local_238.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
          local_238.exp = local_a8.exp;
          local_238.neg = local_a8.neg;
          local_238.fpclass = local_a8.fpclass;
          local_238.prec_elem = local_a8.prec_elem;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_238.neg = (bool)(local_a8.neg ^ 1);
          }
          lVar19 = local_170;
          uVar3 = uVar6;
          uVar9 = uVar7;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
              local_108.fpclass != cpp_dec_float_NaN)) &&
             (local_238.data._M_elems._0_8_ = uVar6, local_238.data._M_elems._8_8_ = uVar7,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_108,&local_238), lVar19 = local_170,
             uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
             iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_b0 + lVar24);
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems._24_5_ = 0;
            local_238.data._M_elems[7]._1_3_ = 0;
            local_238.data._M_elems._32_5_ = 0;
            local_238.data._M_elems[9]._1_3_ = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_238,local_58);
            lVar19 = local_170;
            uVar3 = local_238.data._M_elems._0_8_;
            uVar9 = local_238.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar20,&local_238), lVar19 = local_170,
                     uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
                     0 < iVar13)) {
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8.data._M_elems[9]._1_3_ = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              if (&local_1f8 == (cpp_dec_float<50U,_int,_void> *)(lVar24 + local_c0)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1f8,pcVar20);
                if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                  local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                }
              }
              else {
                if (&local_1f8 != pcVar20) {
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_1f8.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_1f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1f8.exp = pcVar20->exp;
                  local_1f8.neg = pcVar20->neg;
                  local_1f8.fpclass = pcVar20->fpclass;
                  local_1f8.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1f8,(cpp_dec_float<50U,_int,_void> *)(lVar24 + local_c0));
              }
              lVar19 = local_170;
              local_168.fpclass = cpp_dec_float_finite;
              local_168.prec_elem = 10;
              local_168.data._M_elems[0] = 0;
              local_168.data._M_elems[1] = 0;
              local_168.data._M_elems[2] = 0;
              local_168.data._M_elems[3] = 0;
              local_168.data._M_elems[4] = 0;
              local_168.data._M_elems[5] = 0;
              local_168.data._M_elems._24_5_ = 0;
              local_168.data._M_elems[7]._1_3_ = 0;
              local_168.data._M_elems._32_5_ = 0;
              local_168.data._M_elems[9]._1_3_ = 0;
              local_168.exp = 0;
              local_168.neg = false;
              if (&local_168 == local_118) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_168,&local_1f8);
                if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                  local_168.neg = (bool)(local_168.neg ^ 1);
                }
              }
              else {
                local_168.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
                local_168.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
                local_168.data._M_elems[4] = local_1f8.data._M_elems[4];
                local_168.data._M_elems[5] = local_1f8.data._M_elems[5];
                local_168.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
                local_168.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
                local_168.data._M_elems[0] = local_1f8.data._M_elems[0];
                local_168.data._M_elems[1] = local_1f8.data._M_elems[1];
                local_168.data._M_elems[2] = local_1f8.data._M_elems[2];
                local_168.data._M_elems[3] = local_1f8.data._M_elems[3];
                local_168.exp = local_1f8.exp;
                local_168.neg = local_1f8.neg;
                local_168.fpclass = local_1f8.fpclass;
                local_168.prec_elem = local_1f8.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_168,local_118);
              }
              goto LAB_002ccba9;
            }
          }
        }
        else {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<50U,_int,_void> *)(local_60 + lVar24);
          local_238.fpclass = cpp_dec_float_finite;
          local_238.prec_elem = 10;
          local_238.data._M_elems[0] = 0;
          local_238.data._M_elems[1] = 0;
          local_238.data._M_elems[2] = 0;
          local_238.data._M_elems[3] = 0;
          local_238.data._M_elems[4] = 0;
          local_238.data._M_elems[5] = 0;
          local_238.data._M_elems._24_5_ = 0;
          local_238.data._M_elems[7]._1_3_ = 0;
          local_238.data._M_elems._32_5_ = 0;
          local_238.data._M_elems[9]._1_3_ = 0;
          local_238.exp = 0;
          local_238.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_238,local_48);
          lVar19 = local_170;
          uVar3 = local_238.data._M_elems._0_8_;
          uVar9 = local_238.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar20,&local_238), lVar19 = local_170,
                uVar3 = local_238.data._M_elems._0_8_, uVar9 = local_238.data._M_elems._8_8_,
                iVar13 < 0)) {
            local_1f8.fpclass = cpp_dec_float_finite;
            local_1f8.prec_elem = 10;
            local_1f8.data._M_elems[0] = 0;
            local_1f8.data._M_elems[1] = 0;
            local_1f8.data._M_elems[2] = 0;
            local_1f8.data._M_elems[3] = 0;
            local_1f8.data._M_elems[4] = 0;
            local_1f8.data._M_elems[5] = 0;
            local_1f8.data._M_elems._24_5_ = 0;
            local_1f8.data._M_elems[7]._1_3_ = 0;
            local_1f8.data._M_elems._32_5_ = 0;
            local_1f8.data._M_elems[9]._1_3_ = 0;
            local_1f8.exp = 0;
            local_1f8.neg = false;
            if (&local_1f8 == (cpp_dec_float<50U,_int,_void> *)(lVar24 + local_c0)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,pcVar20);
              if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                local_1f8.neg = (bool)(local_1f8.neg ^ 1);
              }
            }
            else {
              if (&local_1f8 != pcVar20) {
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_1f8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_1f8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1f8.exp = pcVar20->exp;
                local_1f8.neg = pcVar20->neg;
                local_1f8.fpclass = pcVar20->fpclass;
                local_1f8.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,(cpp_dec_float<50U,_int,_void> *)(lVar24 + local_c0));
            }
            lVar19 = local_170;
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168.data._M_elems[9]._1_3_ = 0;
            local_168.exp = 0;
            local_168.neg = false;
            pcVar20 = &local_1f8;
            if (&local_168 != local_118) {
              local_168.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1f8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1f8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1f8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1f8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1f8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1f8.data._M_elems[3];
              local_168.exp = local_1f8.exp;
              local_168.neg = local_1f8.neg;
              local_168.fpclass = local_1f8.fpclass;
              local_168.prec_elem = local_1f8.prec_elem;
              pcVar20 = local_118;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_168,pcVar20);
LAB_002ccba9:
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems._24_5_ = 0;
            local_238.data._M_elems[7]._1_3_ = 0;
            local_238.data._M_elems._32_5_ = 0;
            local_238.data._M_elems[9]._1_3_ = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_238,&local_168,&local_108);
            uVar3 = local_238.data._M_elems._0_8_;
            uVar9 = local_238.data._M_elems._8_8_;
            if (((local_238.fpclass != cpp_dec_float_NaN) &&
                (local_1b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_238,&local_1b8), uVar3 = local_238.data._M_elems._0_8_,
               uVar9 = local_238.data._M_elems._8_8_, iVar13 < 0)) {
              iVar13 = (*(local_128->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_110 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(extraout_var_15,iVar13),iVar12);
              local_1b8.data._M_elems[4] = local_238.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_238.data._M_elems[5];
              local_1b8.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
              local_1b8.data._M_elems[0] = local_238.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_238.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_238.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_238.data._M_elems[3];
              local_1b8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
              local_1b8.exp = local_238.exp;
              local_1b8.neg = local_238.neg;
              local_1b8.fpclass = local_238.fpclass;
              local_1b8.prec_elem = local_238.prec_elem;
              local_174 = (uint)lVar23;
              uVar3 = local_238.data._M_elems._0_8_;
              uVar9 = local_238.data._M_elems._8_8_;
            }
          }
        }
        local_238.data._M_elems._8_8_ = uVar9;
        local_238.data._M_elems._0_8_ = uVar3;
        lVar23 = lVar23 + 1;
      } while (lVar23 < *(int *)(lVar19 + 0x58));
    }
    lVar22 = local_b0;
    lVar24 = local_b8;
    lVar23 = local_c8;
    max_00 = local_120;
    uVar18 = local_174;
    if (-1 < (int)local_174) {
      lVar16 = (long)*(int *)(*(long *)(lVar19 + 0x60) + (ulong)local_174 * 4) * 0x38;
      uVar3 = *(undefined8 *)(lVar21 + 0x20 + lVar16);
      local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar21 + lVar16);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar21 + lVar16) + 2);
      puVar1 = (uint *)(lVar21 + 0x10 + lVar16);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(lVar21 + 0x28 + lVar16);
      local_108.neg = *(bool *)(lVar21 + 0x2c + lVar16);
      local_108._48_8_ = *(undefined8 *)(lVar21 + 0x30 + lVar16);
      if (((local_108.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_108,&local_a8), 0 < iVar12)) {
        lVar22 = local_60;
      }
      goto LAB_002cce10;
    }
    if ((int)local_244 < 0) goto LAB_002cd10f;
    lVar17 = (long)*(int *)(*(long *)(lVar17 + 0x60) + (ulong)local_244 * 4) * 0x38;
    uVar3 = *(undefined8 *)(lVar16 + 0x20 + lVar17);
    local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar17);
    local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar17) + 2);
    puVar1 = (uint *)(lVar16 + 0x10 + lVar17);
    local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.exp = *(int *)(lVar16 + 0x28 + lVar17);
    local_108.neg = *(bool *)(lVar16 + 0x2c + lVar17);
    local_108._48_8_ = *(undefined8 *)(lVar16 + 0x30 + lVar17);
    if (((local_108.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_108,&local_a8), 0 < iVar12)) {
      lVar24 = local_68;
    }
LAB_002ccfae:
    local_1b8.data._M_elems._32_8_ = *(undefined8 *)(lVar24 + 0x20 + lVar17);
    local_1b8.data._M_elems._0_8_ = *(undefined8 *)(lVar24 + lVar17);
    local_1b8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar24 + lVar17) + 2);
    puVar1 = (uint *)(lVar24 + 0x10 + lVar17);
    local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1b8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1b8.exp = *(int *)(lVar24 + 0x28 + lVar17);
    local_1b8.neg = *(bool *)(lVar24 + 0x2c + lVar17);
    local_1b8.fpclass = *(fpclass_type *)(lVar24 + 0x30 + lVar17);
    local_1b8.prec_elem = *(int32_t *)(lVar24 + 0x34 + lVar17);
    pcVar20 = (cpp_dec_float<50U,_int,_void> *)(lVar23 + lVar17);
    max_00 = local_120;
    if (&local_168 != pcVar20) {
      local_168.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
      local_168.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
      local_168.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
      local_168.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
      local_168.prec_elem = local_1b8.prec_elem;
      local_168.fpclass = local_1b8.fpclass;
      local_168.data._M_elems._0_8_ = local_1b8.data._M_elems._0_8_;
      local_168.data._M_elems._8_8_ = local_1b8.data._M_elems._8_8_;
      local_168.data._M_elems._16_8_ = local_1b8.data._M_elems._16_8_;
      local_168.exp = local_1b8.exp;
      local_168.neg = local_1b8.neg;
      goto LAB_002cd065;
    }
LAB_002cd06c:
    local_168.fpclass = cpp_dec_float_finite;
    local_168.prec_elem = 10;
    local_168.neg = false;
    local_168.exp = 0;
    local_168.data._M_elems[9]._1_3_ = 0;
    local_168.data._M_elems._32_5_ = 0;
    local_168.data._M_elems[7]._1_3_ = 0;
    local_168.data._M_elems._24_5_ = 0;
    local_168.data._M_elems[4] = 0;
    local_168.data._M_elems[5] = 0;
    local_168.data._M_elems[2] = 0;
    local_168.data._M_elems[3] = 0;
    local_168.data._M_elems[0] = 0;
    local_168.data._M_elems[1] = 0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&local_168,&local_1b8);
    if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
      local_168.neg = (bool)(local_168.neg ^ 1);
    }
  }
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 10;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems._24_5_ = 0;
  local_238.data._M_elems[7]._1_3_ = 0;
  local_238.data._M_elems._32_5_ = 0;
  local_238.data._M_elems[9]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_238,&local_168,&local_108);
  local_1b8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
  local_1b8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
  local_1b8.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
  local_1b8.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
  local_1b8.data._M_elems[4] = local_238.data._M_elems[4];
  local_1b8.data._M_elems[5] = local_238.data._M_elems[5];
  local_1b8.data._M_elems[0] = local_238.data._M_elems[0];
  local_1b8.data._M_elems[1] = local_238.data._M_elems[1];
  local_1b8.data._M_elems[2] = local_238.data._M_elems[2];
  local_1b8.data._M_elems[3] = local_238.data._M_elems[3];
  local_1b8.exp = local_238.exp;
  local_1b8.neg = local_238.neg;
  local_1b8.fpclass = local_238.fpclass;
  local_1b8.prec_elem = local_238.prec_elem;
LAB_002cd10f:
  if (local_110.info != 0) {
    iVar12 = (*(local_128->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    bVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_16,iVar12),(SPxId *)&local_110);
    if (bVar11) {
      lVar16 = 0xa58;
      if ((-1 < (int)uVar18) || (lVar16 = 0xa60, uVar18 = local_244, -1 < (int)local_244)) {
        iVar12 = (*(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar16 = *(long *)(CONCAT44(extraout_var_17,iVar12) + lVar16);
        lVar17 = *(long *)(lVar16 + 0x60);
        lVar19 = *(long *)(lVar16 + 0x70);
        lVar21 = (long)*(int *)(lVar17 + (ulong)uVar18 * 4) * 0x38;
        *(undefined8 *)(lVar19 + 0x30 + lVar21) = 0xa00000000;
        *(undefined8 *)(lVar19 + lVar21) = 0;
        ((undefined8 *)(lVar19 + lVar21))[1] = 0;
        puVar2 = (undefined8 *)(lVar19 + 0x10 + lVar21);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)(lVar19 + 0x1d + lVar21);
        *puVar2 = 0;
        puVar2[1] = 0;
        iVar12 = *(int *)(lVar16 + 0x58);
        *(int *)(lVar16 + 0x58) = iVar12 + -1;
        *(undefined4 *)(lVar17 + (ulong)uVar18 * 4) =
             *(undefined4 *)(lVar17 + -4 + (long)iVar12 * 4);
      }
      DVar15 = (DataKey)selectEnter(local_128,max_00,0,false);
      return (SPxId)DVar15;
    }
  }
  *(undefined8 *)((max_00->m_backend).data._M_elems + 8) = local_1b8.data._M_elems._32_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 4) = local_1b8.data._M_elems._16_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 6) = local_1b8.data._M_elems._24_8_;
  *(undefined8 *)(max_00->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_;
  (max_00->m_backend).exp = local_1b8.exp;
  (max_00->m_backend).neg = local_1b8.neg;
  (max_00->m_backend).fpclass = local_1b8.fpclass;
  (max_00->m_backend).prec_elem = local_1b8.prec_elem;
  return (SPxId)local_110;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}